

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

void __thiscall miniros::RPCManager::RPCManager(RPCManager *this)

{
  string *in_RDI;
  string *this_00;
  XmlRpcServer *unaff_retaddr;
  undefined1 in_stack_ffffffffffffffbf;
  
  std::__cxx11::string::string(in_RDI);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  std::thread::thread((thread *)0x4958ca);
  XmlRpc::XmlRpcServer::XmlRpcServer(unaff_retaddr);
  this_00 = in_RDI + 0xd0;
  std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::vector
            ((vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_> *)
             0x4958f5);
  std::mutex::mutex((mutex *)0x495906);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffffbf);
  WallDuration::WallDuration((WallDuration *)0x49592a);
  std::
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::set((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         *)0x49593d);
  std::mutex::mutex((mutex *)0x49594e);
  std::
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::set((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         *)0x49595f);
  std::mutex::mutex((mutex *)0x495970);
  std::
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::set((set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
         *)0x495981);
  std::mutex::mutex((mutex *)0x495992);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
         *)0x4959a3);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffffbf);
  return;
}

Assistant:

RPCManager::RPCManager()
: port_(0)
, shutting_down_(false)
, unbind_requested_(false)
{
}